

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void ipred_dc_uv(pel *src,pel *dst,int i_dst,int w,int h,u16 avail_cu,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar16;
  short sVar17;
  int iVar18;
  byte *pbVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar40;
  int iVar41;
  int iVar44;
  undefined1 auVar42 [16];
  int iVar45;
  undefined1 auVar43 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar30;
  
  auVar15 = _DAT_00163a40;
  auVar14 = _DAT_00163a30;
  auVar13 = _DAT_00163a20;
  auVar12 = _DAT_00163a10;
  uVar11 = w * 2;
  if ((avail_cu & 2) == 0) {
    if ((avail_cu & 1) == 0) {
      sVar17 = (short)(1 << ((char)bit_depth - 1U & 0x1f));
      sVar16 = sVar17;
    }
    else {
      if ((int)uVar11 < 1) {
        iVar41 = 0;
        iVar28 = 0;
      }
      else {
        uVar21 = 0;
        iVar28 = 0;
        iVar41 = 0;
        do {
          lVar20 = uVar21 + 2;
          lVar30 = uVar21 + 3;
          uVar21 = uVar21 + 2;
          iVar28 = iVar28 + (uint)src[lVar20];
          iVar41 = iVar41 + (uint)src[lVar30];
        } while (uVar21 < uVar11);
      }
      sVar17 = (short)(iVar28 + (w >> 1) >> (g_tbl_log2[w] & 0x1fU));
      sVar16 = (short)((w >> 1) + iVar41 >> (g_tbl_log2[w] & 0x1fU));
    }
  }
  else {
    if (h * 2 < 1) {
      iVar28 = 0;
      iVar41 = 0;
    }
    else {
      pbVar19 = src + -1;
      uVar21 = 0;
      iVar41 = 0;
      iVar28 = 0;
      do {
        iVar41 = iVar41 + (uint)pbVar19[-1];
        iVar28 = iVar28 + (uint)*pbVar19;
        uVar21 = uVar21 + 2;
        pbVar19 = pbVar19 + -2;
      } while (uVar21 < (uint)(h * 2));
    }
    if ((avail_cu & 1) == 0) {
      sVar17 = (short)(iVar41 + (h >> 1) >> (g_tbl_log2[h] & 0x1fU));
      sVar16 = (short)(iVar28 + (h >> 1) >> (g_tbl_log2[h] & 0x1fU));
    }
    else {
      if (0 < (int)uVar11) {
        uVar21 = 0;
        do {
          lVar20 = uVar21 + 2;
          lVar30 = uVar21 + 3;
          uVar21 = uVar21 + 2;
          iVar41 = iVar41 + (uint)src[lVar20];
          iVar28 = iVar28 + (uint)src[lVar30];
        } while (uVar21 < uVar11);
      }
      iVar18 = h + w >> 1;
      iVar45 = (int)(0x1000 / (long)(h + w));
      sVar17 = (short)((iVar41 + iVar18) * iVar45 >> 0xc);
      sVar16 = (short)((iVar18 + iVar28) * iVar45 >> 0xc);
    }
  }
  if (h != 0) {
    sVar17 = sVar16 * 0x100 + sVar17;
    lVar20 = (ulong)(uint)w - 1;
    auVar22._8_4_ = (int)lVar20;
    auVar22._0_8_ = lVar20;
    auVar22._12_4_ = (int)((ulong)lVar20 >> 0x20);
    auVar22 = auVar22 ^ _DAT_00163a40;
    do {
      if (0 < w) {
        lVar20 = 0;
        auVar29 = auVar14;
        auVar31 = auVar13;
        auVar32 = auVar12;
        auVar33 = _DAT_00163a00;
        do {
          auVar34 = auVar29 ^ auVar15;
          iVar41 = auVar22._0_4_;
          iVar40 = -(uint)(iVar41 < auVar34._0_4_);
          iVar28 = auVar22._4_4_;
          auVar35._4_4_ = -(uint)(iVar28 < auVar34._4_4_);
          iVar45 = auVar22._8_4_;
          iVar44 = -(uint)(iVar45 < auVar34._8_4_);
          iVar18 = auVar22._12_4_;
          auVar35._12_4_ = -(uint)(iVar18 < auVar34._12_4_);
          auVar23._4_4_ = iVar40;
          auVar23._0_4_ = iVar40;
          auVar23._8_4_ = iVar44;
          auVar23._12_4_ = iVar44;
          auVar46 = pshuflw(in_XMM15,auVar23,0xe8);
          auVar24._4_4_ = -(uint)(auVar34._4_4_ == iVar28);
          auVar24._12_4_ = -(uint)(auVar34._12_4_ == iVar18);
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar23 = pshuflw(in_XMM1,auVar24,0xe8);
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar47 = pshuflw(auVar46,auVar35,0xe8);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar34 = (auVar47 | auVar23 & auVar46) ^ auVar34;
          auVar34 = packssdw(auVar34,auVar34);
          if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(dst + lVar20) = sVar17;
          }
          auVar47._4_4_ = iVar40;
          auVar47._0_4_ = iVar40;
          auVar47._8_4_ = iVar44;
          auVar47._12_4_ = iVar44;
          auVar35 = auVar24 & auVar47 | auVar35;
          auVar23 = packssdw(auVar35,auVar35);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar23 = packssdw(auVar23 ^ auVar46,auVar23 ^ auVar46);
          if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
            *(short *)(dst + lVar20 + 2) = sVar17;
          }
          auVar23 = auVar31 ^ auVar15;
          iVar40 = -(uint)(iVar41 < auVar23._0_4_);
          auVar42._4_4_ = -(uint)(iVar28 < auVar23._4_4_);
          iVar44 = -(uint)(iVar45 < auVar23._8_4_);
          auVar42._12_4_ = -(uint)(iVar18 < auVar23._12_4_);
          auVar36._4_4_ = iVar40;
          auVar36._0_4_ = iVar40;
          auVar36._8_4_ = iVar44;
          auVar36._12_4_ = iVar44;
          iVar40 = -(uint)(auVar23._4_4_ == iVar28);
          iVar44 = -(uint)(auVar23._12_4_ == iVar18);
          auVar5._4_4_ = iVar40;
          auVar5._0_4_ = iVar40;
          auVar5._8_4_ = iVar44;
          auVar5._12_4_ = iVar44;
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          auVar23 = auVar5 & auVar36 | auVar42;
          auVar23 = packssdw(auVar23,auVar23);
          auVar1._8_4_ = 0xffffffff;
          auVar1._0_8_ = 0xffffffffffffffff;
          auVar1._12_4_ = 0xffffffff;
          auVar23 = packssdw(auVar23 ^ auVar1,auVar23 ^ auVar1);
          if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)(dst + lVar20 + 4) = sVar17;
          }
          auVar23 = pshufhw(auVar23,auVar36,0x84);
          auVar6._4_4_ = iVar40;
          auVar6._0_4_ = iVar40;
          auVar6._8_4_ = iVar44;
          auVar6._12_4_ = iVar44;
          auVar35 = pshufhw(auVar36,auVar6,0x84);
          auVar24 = pshufhw(auVar23,auVar42,0x84);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar25 = (auVar24 | auVar35 & auVar23) ^ auVar25;
          auVar23 = packssdw(auVar25,auVar25);
          if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)(dst + lVar20 + 6) = sVar17;
          }
          auVar23 = auVar32 ^ auVar15;
          iVar40 = -(uint)(iVar41 < auVar23._0_4_);
          auVar38._4_4_ = -(uint)(iVar28 < auVar23._4_4_);
          iVar44 = -(uint)(iVar45 < auVar23._8_4_);
          auVar38._12_4_ = -(uint)(iVar18 < auVar23._12_4_);
          auVar7._4_4_ = iVar40;
          auVar7._0_4_ = iVar40;
          auVar7._8_4_ = iVar44;
          auVar7._12_4_ = iVar44;
          auVar24 = pshuflw(auVar34,auVar7,0xe8);
          auVar26._0_4_ = -(uint)(auVar23._0_4_ == iVar41);
          auVar26._4_4_ = -(uint)(auVar23._4_4_ == iVar28);
          auVar26._8_4_ = -(uint)(auVar23._8_4_ == iVar45);
          auVar26._12_4_ = -(uint)(auVar23._12_4_ == iVar18);
          auVar37._4_4_ = auVar26._4_4_;
          auVar37._0_4_ = auVar26._4_4_;
          auVar37._8_4_ = auVar26._12_4_;
          auVar37._12_4_ = auVar26._12_4_;
          auVar34 = pshuflw(auVar26,auVar37,0xe8);
          auVar38._0_4_ = auVar38._4_4_;
          auVar38._8_4_ = auVar38._12_4_;
          auVar23 = pshuflw(auVar24,auVar38,0xe8);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          in_XMM15 = (auVar23 | auVar34 & auVar24) ^ auVar2;
          auVar34 = packssdw(auVar34 & auVar24,in_XMM15);
          if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(dst + lVar20 + 8) = sVar17;
          }
          auVar8._4_4_ = iVar40;
          auVar8._0_4_ = iVar40;
          auVar8._8_4_ = iVar44;
          auVar8._12_4_ = iVar44;
          auVar38 = auVar37 & auVar8 | auVar38;
          auVar23 = packssdw(auVar38,auVar38);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar34 = packssdw(auVar34,auVar23 ^ auVar3);
          if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(short *)(dst + lVar20 + 10) = sVar17;
          }
          auVar34 = auVar33 ^ auVar15;
          iVar41 = -(uint)(iVar41 < auVar34._0_4_);
          auVar43._4_4_ = -(uint)(iVar28 < auVar34._4_4_);
          iVar45 = -(uint)(iVar45 < auVar34._8_4_);
          auVar43._12_4_ = -(uint)(iVar18 < auVar34._12_4_);
          auVar39._4_4_ = iVar41;
          auVar39._0_4_ = iVar41;
          auVar39._8_4_ = iVar45;
          auVar39._12_4_ = iVar45;
          iVar41 = -(uint)(auVar34._4_4_ == iVar28);
          iVar28 = -(uint)(auVar34._12_4_ == iVar18);
          auVar9._4_4_ = iVar41;
          auVar9._0_4_ = iVar41;
          auVar9._8_4_ = iVar28;
          auVar9._12_4_ = iVar28;
          auVar43._0_4_ = auVar43._4_4_;
          auVar43._8_4_ = auVar43._12_4_;
          auVar34 = auVar9 & auVar39 | auVar43;
          auVar34 = packssdw(auVar34,auVar34);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar34 = packssdw(auVar34 ^ auVar4,auVar34 ^ auVar4);
          if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)(dst + lVar20 + 0xc) = sVar17;
          }
          auVar34 = pshufhw(auVar34,auVar39,0x84);
          auVar10._4_4_ = iVar41;
          auVar10._0_4_ = iVar41;
          auVar10._8_4_ = iVar28;
          auVar10._12_4_ = iVar28;
          auVar24 = pshufhw(auVar39,auVar10,0x84);
          auVar23 = pshufhw(auVar34,auVar43,0x84);
          auVar27._8_4_ = 0xffffffff;
          auVar27._0_8_ = 0xffffffffffffffff;
          auVar27._12_4_ = 0xffffffff;
          auVar27 = (auVar23 | auVar24 & auVar34) ^ auVar27;
          in_XMM1 = packssdw(auVar27,auVar27);
          if ((in_XMM1 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)(dst + lVar20 + 0xe) = sVar17;
          }
          lVar30 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 8;
          auVar29._8_8_ = lVar30 + 8;
          lVar30 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 8;
          auVar31._8_8_ = lVar30 + 8;
          lVar30 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 8;
          auVar32._8_8_ = lVar30 + 8;
          lVar30 = auVar33._8_8_;
          auVar33._0_8_ = auVar33._0_8_ + 8;
          auVar33._8_8_ = lVar30 + 8;
          lVar20 = lVar20 + 0x10;
        } while ((ulong)(w + 7U >> 3) << 4 != lVar20);
      }
      h = h + -1;
      dst = dst + i_dst;
    } while (h != 0);
  }
  return;
}

Assistant:

void ipred_dc_uv(pel *src, pel *dst, int i_dst, int w, int h, u16 avail_cu, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int dc_u = 0, dc_v = 0;
    int i, j;
    int w2 = w << 1;
    int h2 = h << 1;

    if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        for (i = 0; i < h2; i += 2) {
            dc_u += src[-i - 2];
            dc_v += src[-i - 1];
        }
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            for (j = 0; j < w2; j += 2) {
                dc_u += src[j + 2];
                dc_v += src[j + 3];
            }
            dc_u = (dc_u + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
            dc_v = (dc_v + ((w + h) >> 1)) * (4096 / (w + h)) >> 12;
        } else {
            dc_u = (dc_u + (h >> 1)) >> g_tbl_log2[h];
            dc_v = (dc_v + (h >> 1)) >> g_tbl_log2[h];
        }
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        for (j = 0; j < w2; j += 2) {
            dc_u += src[j + 2];
            dc_v += src[j + 3];
        }
        dc_u = (dc_u + (w >> 1)) >> g_tbl_log2[w];
        dc_v = (dc_v + (w >> 1)) >> g_tbl_log2[w];
    } else {
        dc_u = dc_v = 1 << (bit_depth - 1);
    }

    int shift = sizeof(pel) * 8;
    int uv_pixel = (dc_v << shift) + dc_u;

    while (h--) {
        com_mset_2pel(dst, uv_pixel, w);
        dst += i_dst;
    }
}